

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

void __thiscall
cmELFInternalImpl<cmELFTypes64>::ByteSwap
          (cmELFInternalImpl<cmELFTypes64> *this,ELF_Shdr *sec_header)

{
  cmELFByteSwap(sec_header);
  cmELFByteSwap(&sec_header->sh_type);
  cmELFByteSwap(&sec_header->sh_flags);
  cmELFByteSwap(&sec_header->sh_addr);
  cmELFByteSwap(&sec_header->sh_offset);
  cmELFByteSwap(&sec_header->sh_size);
  cmELFByteSwap(&sec_header->sh_link);
  cmELFByteSwap(&sec_header->sh_info);
  cmELFByteSwap(&sec_header->sh_addralign);
  cmELFByteSwap(&sec_header->sh_entsize);
  return;
}

Assistant:

void ByteSwap(ELF_Shdr& sec_header)
  {
    cmELFByteSwap(sec_header.sh_name);
    cmELFByteSwap(sec_header.sh_type);
    cmELFByteSwap(sec_header.sh_flags);
    cmELFByteSwap(sec_header.sh_addr);
    cmELFByteSwap(sec_header.sh_offset);
    cmELFByteSwap(sec_header.sh_size);
    cmELFByteSwap(sec_header.sh_link);
    cmELFByteSwap(sec_header.sh_info);
    cmELFByteSwap(sec_header.sh_addralign);
    cmELFByteSwap(sec_header.sh_entsize);
  }